

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pthread.cc
# Opt level: O0

void __thiscall gutil::Thread::join(Thread *this)

{
  long *in_RDI;
  
  if ((*(byte *)*in_RDI & 1) != 0) {
    pthread_join(*(pthread_t *)(*in_RDI + 8),(void **)0x0);
    *(undefined1 *)*in_RDI = 0;
  }
  return;
}

Assistant:

void Thread::join()
{
  if (p->running)
  {
#ifndef NDEBUG
    int err=
#endif
      pthread_join(p->thread, 0);

    p->running=false;

    assert(err == 0);
  }
}